

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

void __thiscall QLineEditPrivate::handleWindowActivate(QLineEditPrivate *this)

{
  QWidgetLineControl *this_00;
  bool bVar1;
  
  bVar1 = QWidget::hasFocus(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
  if (((!bVar1) && (this_00 = this->control, (this_00->m_text).d.size != 0)) &&
     (this_00->m_selstart < this_00->m_selend)) {
    QWidgetLineControl::deselect((QWidgetLineControl *)this_00);
    return;
  }
  return;
}

Assistant:

void QLineEditPrivate::handleWindowActivate()
{
    Q_Q(QLineEdit);
    if (!q->hasFocus() && control->hasSelectedText())
        control->deselect();
}